

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::BuildDefUseManager(IRContext *this)

{
  Module *module;
  DefUseManager *__ptr;
  DefUseManager *this_00;
  
  module = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_00 = (DefUseManager *)operator_new(0xa0);
  analysis::DefUseManager::DefUseManager(this_00,module);
  __ptr = (this->def_use_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  (this->def_use_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl = this_00;
  if (__ptr != (DefUseManager *)0x0) {
    std::default_delete<spvtools::opt::analysis::DefUseManager>::operator()
              ((default_delete<spvtools::opt::analysis::DefUseManager> *)&this->def_use_mgr_,__ptr);
  }
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisBegin;
  return;
}

Assistant:

void BuildDefUseManager() {
    def_use_mgr_ = MakeUnique<analysis::DefUseManager>(module());
    valid_analyses_ = valid_analyses_ | kAnalysisDefUse;
  }